

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_PrintFreeFieldNumbers_Test::
TestBody(CommandLineInterfaceTest_PrintFreeFieldNumbers_Test *this)

{
  string_view local_d8 [2];
  allocator<char> local_b1;
  string local_b0;
  string_view local_90;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  string_view local_40;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_PrintFreeFieldNumbers_Test *local_10;
  CommandLineInterfaceTest_PrintFreeFieldNumbers_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"foo.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,
             "syntax = \"proto2\";\npackage foo;\nmessage Foo {\n  optional int32 a = 2;\n  optional string b = 4;\n  optional string c = 5;\n  optional int64 d = 8;\n  optional double e = 10;\n}\n"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"bar.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_50,
             "syntax = \"proto2\";\nmessage Bar {\n  optional int32 a = 2;\n  extensions 4 to 5;\n  optional int64 d = 8;\n  extensions 10;\n}\n"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_40,local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"baz.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,
             "syntax = \"proto2\";\nmessage Baz {\n  optional int32 a = 2;\n  optional int64 d = 8;\n  extensions 15 to max;\n  extensions 13;\n  extensions 10 to 12;\n  extensions 5;\n  extensions 4;\n}\n"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_60,local_70);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,"quz.proto");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,
             "syntax = \"proto2\";\nmessage Quz {\n  message Foo {}\n  optional int32 a = 2;\n  optional group C = 4 {\n    optional int32 d = 5;\n  }\n  extensions 8 to 10;\n  optional group E = 11 {\n    optional int32 f = 9;\n    optional group G = 15 {\n      message Foo {}\n    }\n  }\n}\n"
            );
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_80,local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,
             "protocol_compiler --print_free_field_numbers --proto_path=$tmpdir foo.proto bar.proto baz.proto quz.proto"
             ,&local_b1);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_d8,
             "foo.Foo                             free: 1 3 6-7 9 11-INF\nBar                                 free: 1 3 6-7 9 11-INF\nBaz                                 free: 1 3 6-7 9 14\nQuz.Foo                             free: 1-INF\nQuz.C                               free: 1-4 6-INF\nQuz.E.G.Foo                         free: 1-INF\nQuz.E.G                             free: 1-INF\nQuz.E                               free: 1-8 10-14 16-INF\nQuz                                 free: 1 3 5-7 12-INF\n"
            );
  CommandLineInterfaceTester::ExpectCapturedStdout((CommandLineInterfaceTester *)this,local_d8[0]);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, PrintFreeFieldNumbers) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "package foo;\n"
                 "message Foo {\n"
                 "  optional int32 a = 2;\n"
                 "  optional string b = 4;\n"
                 "  optional string c = 5;\n"
                 "  optional int64 d = 8;\n"
                 "  optional double e = 10;\n"
                 "}\n");
  CreateTempFile("bar.proto",
                 "syntax = \"proto2\";\n"
                 "message Bar {\n"
                 "  optional int32 a = 2;\n"
                 "  extensions 4 to 5;\n"
                 "  optional int64 d = 8;\n"
                 "  extensions 10;\n"
                 "}\n");
  CreateTempFile("baz.proto",
                 "syntax = \"proto2\";\n"
                 "message Baz {\n"
                 "  optional int32 a = 2;\n"
                 "  optional int64 d = 8;\n"
                 "  extensions 15 to max;\n"  // unordered.
                 "  extensions 13;\n"
                 "  extensions 10 to 12;\n"
                 "  extensions 5;\n"
                 "  extensions 4;\n"
                 "}\n");
  CreateTempFile(
      "quz.proto",
      "syntax = \"proto2\";\n"
      "message Quz {\n"
      "  message Foo {}\n"  // nested message
      "  optional int32 a = 2;\n"
      "  optional group C = 4 {\n"
      "    optional int32 d = 5;\n"
      "  }\n"
      "  extensions 8 to 10;\n"
      "  optional group E = 11 {\n"
      "    optional int32 f = 9;\n"    // explicitly reuse extension range 8-10
      "    optional group G = 15 {\n"  // nested group
      "      message Foo {}\n"         // nested message inside nested group
      "    }\n"
      "  }\n"
      "}\n");

  Run("protocol_compiler --print_free_field_numbers --proto_path=$tmpdir "
      "foo.proto bar.proto baz.proto quz.proto");

  ExpectNoErrors();

  // TODO: Cygwin doesn't work well if we try to capture stderr and
  // stdout at the same time. Need to figure out why and add this test back
  // for Cygwin.
#if !defined(__CYGWIN__)
  ExpectCapturedStdout(
      "foo.Foo                             free: 1 3 6-7 9 11-INF\n"
      "Bar                                 free: 1 3 6-7 9 11-INF\n"
      "Baz                                 free: 1 3 6-7 9 14\n"
      "Quz.Foo                             free: 1-INF\n"
      "Quz.C                               free: 1-4 6-INF\n"
      "Quz.E.G.Foo                         free: 1-INF\n"
      "Quz.E.G                             free: 1-INF\n"
      "Quz.E                               free: 1-8 10-14 16-INF\n"
      "Quz                                 free: 1 3 5-7 12-INF\n");
#endif
}